

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>
                   (string *__return_storage_ptr__,
                   basic_string_view<char,_std::char_traits<char>_> *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [3],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   basic_string_view<char,_std::char_traits<char>_> *args_2)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view view;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b0;
  cmAlphaNum local_178;
  cmAlphaNum local_140;
  size_t local_108;
  char *local_100;
  cmAlphaNum local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  string_view *local_38;
  basic_string_view<char,_std::char_traits<char>_> *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  basic_string_view<char,_std::char_traits<char>_> *a_local;
  
  local_108 = a->_M_len;
  local_100 = a->_M_str;
  view._M_len = a->_M_len;
  view._M_str = a->_M_str;
  local_38 = args_2;
  args_local_2 = (basic_string_view<char,_std::char_traits<char>_> *)args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [3])b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (basic_string_view<char,_std::char_traits<char>_> *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_f8,view);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_c0,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
              ::makePair,&local_f8);
  cmAlphaNum::cmAlphaNum(&local_140,(string *)args_local);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
              ::makePair,&local_140);
  cmAlphaNum::cmAlphaNum(&local_178,(char *)args_local_1);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
              ::makePair,&local_178);
  cmAlphaNum::cmAlphaNum(&local_1b0,(string *)args_local_2);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
              ::makePair,&local_1b0);
  cmAlphaNum::cmAlphaNum(&local_1e8,*local_38);
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>(std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&)
              ::makePair,&local_1e8);
  local_48 = &local_c0;
  local_40 = 5;
  views._M_len = 5;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}